

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# teglBufferAgeTests.cpp
# Opt level: O1

int __thiscall deqp::egl::BufferAgeTests::init(BufferAgeTests *this,EVP_PKEY_CTX *ctx)

{
  pointer *ppDVar1;
  int iVar2;
  EglTestContext *eglTestCtx;
  deUint32 dVar3;
  int extraout_EAX;
  TestCaseGroup *pTVar4;
  long *plVar5;
  undefined8 *puVar6;
  TestCase *this_00;
  allocator_type *paVar7;
  long *plVar8;
  long lVar9;
  char *pcVar10;
  vector<deqp::egl::(anonymous_namespace)::BufferAgeTest::DrawType,_std::allocator<deqp::egl::(anonymous_namespace)::BufferAgeTest::DrawType>_>
  *drawTypes;
  vector<deqp::egl::(anonymous_namespace)::BufferAgeTest::DrawType,_std::allocator<deqp::egl::(anonymous_namespace)::BufferAgeTest::DrawType>_>
  *extraout_RDX;
  vector<deqp::egl::(anonymous_namespace)::BufferAgeTest::DrawType,_std::allocator<deqp::egl::(anonymous_namespace)::BufferAgeTest::DrawType>_>
  *extraout_RDX_00;
  ulong uVar11;
  undefined8 uVar12;
  vector<deqp::egl::(anonymous_namespace)::BufferAgeTest::DrawType,_std::allocator<deqp::egl::(anonymous_namespace)::BufferAgeTest::DrawType>_>
  *pvVar13;
  _anonymous_namespace_ *this_01;
  vector<std::vector<deqp::egl::(anonymous_namespace)::BufferAgeTest::DrawType,_std::allocator<deqp::egl::(anonymous_namespace)::BufferAgeTest::DrawType>_>,_std::allocator<std::vector<deqp::egl::(anonymous_namespace)::BufferAgeTest::DrawType,_std::allocator<deqp::egl::(anonymous_namespace)::BufferAgeTest::DrawType>_>_>_>
  frameDrawTypes;
  string name;
  DrawType renderClear [2];
  DrawType clearRender [2];
  value_type local_148;
  long lStack_130;
  byte local_119;
  vector<std::vector<deqp::egl::(anonymous_namespace)::BufferAgeTest::DrawType,_std::allocator<deqp::egl::(anonymous_namespace)::BufferAgeTest::DrawType>_>,_std::allocator<std::vector<deqp::egl::(anonymous_namespace)::BufferAgeTest::DrawType,_std::allocator<deqp::egl::(anonymous_namespace)::BufferAgeTest::DrawType>_>_>_>
  local_118;
  long *local_100;
  undefined8 local_f8;
  long local_f0;
  undefined8 uStack_e8;
  TestNode *local_e0;
  TestCaseGroup *local_d8;
  allocator_type *local_d0;
  long local_c8;
  long local_c0;
  long lStack_b8;
  string local_b0;
  long local_90;
  vector<deqp::egl::(anonymous_namespace)::BufferAgeTest::DrawType,_std::allocator<deqp::egl::(anonymous_namespace)::BufferAgeTest::DrawType>_>
  *local_88;
  _anonymous_namespace_ *local_80;
  DrawType local_78 [4];
  ulong local_68;
  TestCaseGroup *local_60;
  long local_58;
  string local_50;
  
  local_78[2] = DRAWTYPE_GLES2_CLEAR;
  local_78[3] = DRAWTYPE_GLES2_RENDER;
  local_78[0] = DRAWTYPE_GLES2_RENDER;
  local_78[1] = DRAWTYPE_GLES2_CLEAR;
  local_118.
  super__Vector_base<std::vector<deqp::egl::(anonymous_namespace)::BufferAgeTest::DrawType,_std::allocator<deqp::egl::(anonymous_namespace)::BufferAgeTest::DrawType>_>,_std::allocator<std::vector<deqp::egl::(anonymous_namespace)::BufferAgeTest::DrawType,_std::allocator<deqp::egl::(anonymous_namespace)::BufferAgeTest::DrawType>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_118.
  super__Vector_base<std::vector<deqp::egl::(anonymous_namespace)::BufferAgeTest::DrawType,_std::allocator<deqp::egl::(anonymous_namespace)::BufferAgeTest::DrawType>_>,_std::allocator<std::vector<deqp::egl::(anonymous_namespace)::BufferAgeTest::DrawType,_std::allocator<deqp::egl::(anonymous_namespace)::BufferAgeTest::DrawType>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_118.
  super__Vector_base<std::vector<deqp::egl::(anonymous_namespace)::BufferAgeTest::DrawType,_std::allocator<deqp::egl::(anonymous_namespace)::BufferAgeTest::DrawType>_>,_std::allocator<std::vector<deqp::egl::(anonymous_namespace)::BufferAgeTest::DrawType,_std::allocator<deqp::egl::(anonymous_namespace)::BufferAgeTest::DrawType>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_148.
  super__Vector_base<deqp::egl::(anonymous_namespace)::BufferAgeTest::DrawType,_std::allocator<deqp::egl::(anonymous_namespace)::BufferAgeTest::DrawType>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_148.
  super__Vector_base<deqp::egl::(anonymous_namespace)::BufferAgeTest::DrawType,_std::allocator<deqp::egl::(anonymous_namespace)::BufferAgeTest::DrawType>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_148.
  super__Vector_base<deqp::egl::(anonymous_namespace)::BufferAgeTest::DrawType,_std::allocator<deqp::egl::(anonymous_namespace)::BufferAgeTest::DrawType>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_e0 = (TestNode *)this;
  std::
  vector<std::vector<deqp::egl::(anonymous_namespace)::BufferAgeTest::DrawType,_std::allocator<deqp::egl::(anonymous_namespace)::BufferAgeTest::DrawType>_>,_std::allocator<std::vector<deqp::egl::(anonymous_namespace)::BufferAgeTest::DrawType,_std::allocator<deqp::egl::(anonymous_namespace)::BufferAgeTest::DrawType>_>_>_>
  ::push_back(&local_118,&local_148);
  if (local_148.
      super__Vector_base<deqp::egl::(anonymous_namespace)::BufferAgeTest::DrawType,_std::allocator<deqp::egl::(anonymous_namespace)::BufferAgeTest::DrawType>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_148.
                    super__Vector_base<deqp::egl::(anonymous_namespace)::BufferAgeTest::DrawType,_std::allocator<deqp::egl::(anonymous_namespace)::BufferAgeTest::DrawType>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_148.
                          super__Vector_base<deqp::egl::(anonymous_namespace)::BufferAgeTest::DrawType,_std::allocator<deqp::egl::(anonymous_namespace)::BufferAgeTest::DrawType>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_148.
                          super__Vector_base<deqp::egl::(anonymous_namespace)::BufferAgeTest::DrawType,_std::allocator<deqp::egl::(anonymous_namespace)::BufferAgeTest::DrawType>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  local_148.
  super__Vector_base<deqp::egl::(anonymous_namespace)::BufferAgeTest::DrawType,_std::allocator<deqp::egl::(anonymous_namespace)::BufferAgeTest::DrawType>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_148.
  super__Vector_base<deqp::egl::(anonymous_namespace)::BufferAgeTest::DrawType,_std::allocator<deqp::egl::(anonymous_namespace)::BufferAgeTest::DrawType>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_148.
  super__Vector_base<deqp::egl::(anonymous_namespace)::BufferAgeTest::DrawType,_std::allocator<deqp::egl::(anonymous_namespace)::BufferAgeTest::DrawType>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_148.
  super__Vector_base<deqp::egl::(anonymous_namespace)::BufferAgeTest::DrawType,_std::allocator<deqp::egl::(anonymous_namespace)::BufferAgeTest::DrawType>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)operator_new(4);
  local_148.
  super__Vector_base<deqp::egl::(anonymous_namespace)::BufferAgeTest::DrawType,_std::allocator<deqp::egl::(anonymous_namespace)::BufferAgeTest::DrawType>_>
  ._M_impl.super__Vector_impl_data._M_finish =
       local_148.
       super__Vector_base<deqp::egl::(anonymous_namespace)::BufferAgeTest::DrawType,_std::allocator<deqp::egl::(anonymous_namespace)::BufferAgeTest::DrawType>_>
       ._M_impl.super__Vector_impl_data._M_start + 1;
  *local_148.
   super__Vector_base<deqp::egl::(anonymous_namespace)::BufferAgeTest::DrawType,_std::allocator<deqp::egl::(anonymous_namespace)::BufferAgeTest::DrawType>_>
   ._M_impl.super__Vector_impl_data._M_start = DRAWTYPE_GLES2_CLEAR;
  local_148.
  super__Vector_base<deqp::egl::(anonymous_namespace)::BufferAgeTest::DrawType,_std::allocator<deqp::egl::(anonymous_namespace)::BufferAgeTest::DrawType>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage =
       local_148.
       super__Vector_base<deqp::egl::(anonymous_namespace)::BufferAgeTest::DrawType,_std::allocator<deqp::egl::(anonymous_namespace)::BufferAgeTest::DrawType>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  std::
  vector<std::vector<deqp::egl::(anonymous_namespace)::BufferAgeTest::DrawType,_std::allocator<deqp::egl::(anonymous_namespace)::BufferAgeTest::DrawType>_>,_std::allocator<std::vector<deqp::egl::(anonymous_namespace)::BufferAgeTest::DrawType,_std::allocator<deqp::egl::(anonymous_namespace)::BufferAgeTest::DrawType>_>_>_>
  ::push_back(&local_118,&local_148);
  if (local_148.
      super__Vector_base<deqp::egl::(anonymous_namespace)::BufferAgeTest::DrawType,_std::allocator<deqp::egl::(anonymous_namespace)::BufferAgeTest::DrawType>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_148.
                    super__Vector_base<deqp::egl::(anonymous_namespace)::BufferAgeTest::DrawType,_std::allocator<deqp::egl::(anonymous_namespace)::BufferAgeTest::DrawType>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_148.
                          super__Vector_base<deqp::egl::(anonymous_namespace)::BufferAgeTest::DrawType,_std::allocator<deqp::egl::(anonymous_namespace)::BufferAgeTest::DrawType>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_148.
                          super__Vector_base<deqp::egl::(anonymous_namespace)::BufferAgeTest::DrawType,_std::allocator<deqp::egl::(anonymous_namespace)::BufferAgeTest::DrawType>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  local_148.
  super__Vector_base<deqp::egl::(anonymous_namespace)::BufferAgeTest::DrawType,_std::allocator<deqp::egl::(anonymous_namespace)::BufferAgeTest::DrawType>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_148.
  super__Vector_base<deqp::egl::(anonymous_namespace)::BufferAgeTest::DrawType,_std::allocator<deqp::egl::(anonymous_namespace)::BufferAgeTest::DrawType>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_148.
  super__Vector_base<deqp::egl::(anonymous_namespace)::BufferAgeTest::DrawType,_std::allocator<deqp::egl::(anonymous_namespace)::BufferAgeTest::DrawType>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_148.
  super__Vector_base<deqp::egl::(anonymous_namespace)::BufferAgeTest::DrawType,_std::allocator<deqp::egl::(anonymous_namespace)::BufferAgeTest::DrawType>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)operator_new(4);
  local_148.
  super__Vector_base<deqp::egl::(anonymous_namespace)::BufferAgeTest::DrawType,_std::allocator<deqp::egl::(anonymous_namespace)::BufferAgeTest::DrawType>_>
  ._M_impl.super__Vector_impl_data._M_finish =
       local_148.
       super__Vector_base<deqp::egl::(anonymous_namespace)::BufferAgeTest::DrawType,_std::allocator<deqp::egl::(anonymous_namespace)::BufferAgeTest::DrawType>_>
       ._M_impl.super__Vector_impl_data._M_start + 1;
  *local_148.
   super__Vector_base<deqp::egl::(anonymous_namespace)::BufferAgeTest::DrawType,_std::allocator<deqp::egl::(anonymous_namespace)::BufferAgeTest::DrawType>_>
   ._M_impl.super__Vector_impl_data._M_start = DRAWTYPE_GLES2_RENDER;
  local_148.
  super__Vector_base<deqp::egl::(anonymous_namespace)::BufferAgeTest::DrawType,_std::allocator<deqp::egl::(anonymous_namespace)::BufferAgeTest::DrawType>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage =
       local_148.
       super__Vector_base<deqp::egl::(anonymous_namespace)::BufferAgeTest::DrawType,_std::allocator<deqp::egl::(anonymous_namespace)::BufferAgeTest::DrawType>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  std::
  vector<std::vector<deqp::egl::(anonymous_namespace)::BufferAgeTest::DrawType,_std::allocator<deqp::egl::(anonymous_namespace)::BufferAgeTest::DrawType>_>,_std::allocator<std::vector<deqp::egl::(anonymous_namespace)::BufferAgeTest::DrawType,_std::allocator<deqp::egl::(anonymous_namespace)::BufferAgeTest::DrawType>_>_>_>
  ::push_back(&local_118,&local_148);
  if (local_148.
      super__Vector_base<deqp::egl::(anonymous_namespace)::BufferAgeTest::DrawType,_std::allocator<deqp::egl::(anonymous_namespace)::BufferAgeTest::DrawType>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_148.
                    super__Vector_base<deqp::egl::(anonymous_namespace)::BufferAgeTest::DrawType,_std::allocator<deqp::egl::(anonymous_namespace)::BufferAgeTest::DrawType>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_148.
                          super__Vector_base<deqp::egl::(anonymous_namespace)::BufferAgeTest::DrawType,_std::allocator<deqp::egl::(anonymous_namespace)::BufferAgeTest::DrawType>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_148.
                          super__Vector_base<deqp::egl::(anonymous_namespace)::BufferAgeTest::DrawType,_std::allocator<deqp::egl::(anonymous_namespace)::BufferAgeTest::DrawType>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  local_148.
  super__Vector_base<deqp::egl::(anonymous_namespace)::BufferAgeTest::DrawType,_std::allocator<deqp::egl::(anonymous_namespace)::BufferAgeTest::DrawType>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_148.
  super__Vector_base<deqp::egl::(anonymous_namespace)::BufferAgeTest::DrawType,_std::allocator<deqp::egl::(anonymous_namespace)::BufferAgeTest::DrawType>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_148.
  super__Vector_base<deqp::egl::(anonymous_namespace)::BufferAgeTest::DrawType,_std::allocator<deqp::egl::(anonymous_namespace)::BufferAgeTest::DrawType>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_148.
  super__Vector_base<deqp::egl::(anonymous_namespace)::BufferAgeTest::DrawType,_std::allocator<deqp::egl::(anonymous_namespace)::BufferAgeTest::DrawType>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)operator_new(8);
  local_148.
  super__Vector_base<deqp::egl::(anonymous_namespace)::BufferAgeTest::DrawType,_std::allocator<deqp::egl::(anonymous_namespace)::BufferAgeTest::DrawType>_>
  ._M_impl.super__Vector_impl_data._M_finish =
       local_148.
       super__Vector_base<deqp::egl::(anonymous_namespace)::BufferAgeTest::DrawType,_std::allocator<deqp::egl::(anonymous_namespace)::BufferAgeTest::DrawType>_>
       ._M_impl.super__Vector_impl_data._M_start + 2;
  local_148.
  super__Vector_base<deqp::egl::(anonymous_namespace)::BufferAgeTest::DrawType,_std::allocator<deqp::egl::(anonymous_namespace)::BufferAgeTest::DrawType>_>
  ._M_impl.super__Vector_impl_data._M_start[0] = DRAWTYPE_GLES2_CLEAR;
  local_148.
  super__Vector_base<deqp::egl::(anonymous_namespace)::BufferAgeTest::DrawType,_std::allocator<deqp::egl::(anonymous_namespace)::BufferAgeTest::DrawType>_>
  ._M_impl.super__Vector_impl_data._M_start[1] = DRAWTYPE_GLES2_CLEAR;
  local_148.
  super__Vector_base<deqp::egl::(anonymous_namespace)::BufferAgeTest::DrawType,_std::allocator<deqp::egl::(anonymous_namespace)::BufferAgeTest::DrawType>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage =
       local_148.
       super__Vector_base<deqp::egl::(anonymous_namespace)::BufferAgeTest::DrawType,_std::allocator<deqp::egl::(anonymous_namespace)::BufferAgeTest::DrawType>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  std::
  vector<std::vector<deqp::egl::(anonymous_namespace)::BufferAgeTest::DrawType,_std::allocator<deqp::egl::(anonymous_namespace)::BufferAgeTest::DrawType>_>,_std::allocator<std::vector<deqp::egl::(anonymous_namespace)::BufferAgeTest::DrawType,_std::allocator<deqp::egl::(anonymous_namespace)::BufferAgeTest::DrawType>_>_>_>
  ::push_back(&local_118,&local_148);
  if (local_148.
      super__Vector_base<deqp::egl::(anonymous_namespace)::BufferAgeTest::DrawType,_std::allocator<deqp::egl::(anonymous_namespace)::BufferAgeTest::DrawType>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_148.
                    super__Vector_base<deqp::egl::(anonymous_namespace)::BufferAgeTest::DrawType,_std::allocator<deqp::egl::(anonymous_namespace)::BufferAgeTest::DrawType>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_148.
                          super__Vector_base<deqp::egl::(anonymous_namespace)::BufferAgeTest::DrawType,_std::allocator<deqp::egl::(anonymous_namespace)::BufferAgeTest::DrawType>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_148.
                          super__Vector_base<deqp::egl::(anonymous_namespace)::BufferAgeTest::DrawType,_std::allocator<deqp::egl::(anonymous_namespace)::BufferAgeTest::DrawType>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  local_148.
  super__Vector_base<deqp::egl::(anonymous_namespace)::BufferAgeTest::DrawType,_std::allocator<deqp::egl::(anonymous_namespace)::BufferAgeTest::DrawType>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_148.
  super__Vector_base<deqp::egl::(anonymous_namespace)::BufferAgeTest::DrawType,_std::allocator<deqp::egl::(anonymous_namespace)::BufferAgeTest::DrawType>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_148.
  super__Vector_base<deqp::egl::(anonymous_namespace)::BufferAgeTest::DrawType,_std::allocator<deqp::egl::(anonymous_namespace)::BufferAgeTest::DrawType>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_148.
  super__Vector_base<deqp::egl::(anonymous_namespace)::BufferAgeTest::DrawType,_std::allocator<deqp::egl::(anonymous_namespace)::BufferAgeTest::DrawType>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)operator_new(8);
  paVar7 = (allocator_type *)
           ((long)local_148.
                  super__Vector_base<deqp::egl::(anonymous_namespace)::BufferAgeTest::DrawType,_std::allocator<deqp::egl::(anonymous_namespace)::BufferAgeTest::DrawType>_>
                  ._M_impl.super__Vector_impl_data._M_start + 8);
  lVar9 = 0;
  do {
    *(undefined4 *)
     ((long)local_148.
            super__Vector_base<deqp::egl::(anonymous_namespace)::BufferAgeTest::DrawType,_std::allocator<deqp::egl::(anonymous_namespace)::BufferAgeTest::DrawType>_>
            ._M_impl.super__Vector_impl_data._M_start + lVar9) = 1;
    lVar9 = lVar9 + 4;
  } while (lVar9 != 8);
  local_148.
  super__Vector_base<deqp::egl::(anonymous_namespace)::BufferAgeTest::DrawType,_std::allocator<deqp::egl::(anonymous_namespace)::BufferAgeTest::DrawType>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)paVar7;
  local_148.
  super__Vector_base<deqp::egl::(anonymous_namespace)::BufferAgeTest::DrawType,_std::allocator<deqp::egl::(anonymous_namespace)::BufferAgeTest::DrawType>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)paVar7;
  std::
  vector<std::vector<deqp::egl::(anonymous_namespace)::BufferAgeTest::DrawType,_std::allocator<deqp::egl::(anonymous_namespace)::BufferAgeTest::DrawType>_>,_std::allocator<std::vector<deqp::egl::(anonymous_namespace)::BufferAgeTest::DrawType,_std::allocator<deqp::egl::(anonymous_namespace)::BufferAgeTest::DrawType>_>_>_>
  ::push_back(&local_118,&local_148);
  if ((pointer *)
      local_148.
      super__Vector_base<deqp::egl::(anonymous_namespace)::BufferAgeTest::DrawType,_std::allocator<deqp::egl::(anonymous_namespace)::BufferAgeTest::DrawType>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer *)0x0) {
    operator_delete(local_148.
                    super__Vector_base<deqp::egl::(anonymous_namespace)::BufferAgeTest::DrawType,_std::allocator<deqp::egl::(anonymous_namespace)::BufferAgeTest::DrawType>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_148.
                          super__Vector_base<deqp::egl::(anonymous_namespace)::BufferAgeTest::DrawType,_std::allocator<deqp::egl::(anonymous_namespace)::BufferAgeTest::DrawType>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_148.
                          super__Vector_base<deqp::egl::(anonymous_namespace)::BufferAgeTest::DrawType,_std::allocator<deqp::egl::(anonymous_namespace)::BufferAgeTest::DrawType>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  std::
  vector<deqp::egl::(anonymous_namespace)::BufferAgeTest::DrawType,std::allocator<deqp::egl::(anonymous_namespace)::BufferAgeTest::DrawType>>
  ::vector<deqp::egl::(anonymous_namespace)::BufferAgeTest::DrawType_const*,void>
            ((vector<deqp::egl::(anonymous_namespace)::BufferAgeTest::DrawType,std::allocator<deqp::egl::(anonymous_namespace)::BufferAgeTest::DrawType>>
              *)&local_148,local_78 + 2,(DrawType *)&local_68,paVar7);
  std::
  vector<std::vector<deqp::egl::(anonymous_namespace)::BufferAgeTest::DrawType,_std::allocator<deqp::egl::(anonymous_namespace)::BufferAgeTest::DrawType>_>,_std::allocator<std::vector<deqp::egl::(anonymous_namespace)::BufferAgeTest::DrawType,_std::allocator<deqp::egl::(anonymous_namespace)::BufferAgeTest::DrawType>_>_>_>
  ::push_back(&local_118,&local_148);
  if ((pointer *)
      local_148.
      super__Vector_base<deqp::egl::(anonymous_namespace)::BufferAgeTest::DrawType,_std::allocator<deqp::egl::(anonymous_namespace)::BufferAgeTest::DrawType>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer *)0x0) {
    operator_delete(local_148.
                    super__Vector_base<deqp::egl::(anonymous_namespace)::BufferAgeTest::DrawType,_std::allocator<deqp::egl::(anonymous_namespace)::BufferAgeTest::DrawType>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_148.
                          super__Vector_base<deqp::egl::(anonymous_namespace)::BufferAgeTest::DrawType,_std::allocator<deqp::egl::(anonymous_namespace)::BufferAgeTest::DrawType>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_148.
                          super__Vector_base<deqp::egl::(anonymous_namespace)::BufferAgeTest::DrawType,_std::allocator<deqp::egl::(anonymous_namespace)::BufferAgeTest::DrawType>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  std::
  vector<deqp::egl::(anonymous_namespace)::BufferAgeTest::DrawType,std::allocator<deqp::egl::(anonymous_namespace)::BufferAgeTest::DrawType>>
  ::vector<deqp::egl::(anonymous_namespace)::BufferAgeTest::DrawType_const*,void>
            ((vector<deqp::egl::(anonymous_namespace)::BufferAgeTest::DrawType,std::allocator<deqp::egl::(anonymous_namespace)::BufferAgeTest::DrawType>>
              *)&local_148,local_78,local_78 + 2,paVar7);
  std::
  vector<std::vector<deqp::egl::(anonymous_namespace)::BufferAgeTest::DrawType,_std::allocator<deqp::egl::(anonymous_namespace)::BufferAgeTest::DrawType>_>,_std::allocator<std::vector<deqp::egl::(anonymous_namespace)::BufferAgeTest::DrawType,_std::allocator<deqp::egl::(anonymous_namespace)::BufferAgeTest::DrawType>_>_>_>
  ::push_back(&local_118,&local_148);
  if ((pointer *)
      local_148.
      super__Vector_base<deqp::egl::(anonymous_namespace)::BufferAgeTest::DrawType,_std::allocator<deqp::egl::(anonymous_namespace)::BufferAgeTest::DrawType>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer *)0x0) {
    operator_delete(local_148.
                    super__Vector_base<deqp::egl::(anonymous_namespace)::BufferAgeTest::DrawType,_std::allocator<deqp::egl::(anonymous_namespace)::BufferAgeTest::DrawType>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_148.
                          super__Vector_base<deqp::egl::(anonymous_namespace)::BufferAgeTest::DrawType,_std::allocator<deqp::egl::(anonymous_namespace)::BufferAgeTest::DrawType>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_148.
                          super__Vector_base<deqp::egl::(anonymous_namespace)::BufferAgeTest::DrawType,_std::allocator<deqp::egl::(anonymous_namespace)::BufferAgeTest::DrawType>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  ppDVar1 = &local_148.
             super__Vector_base<deqp::egl::(anonymous_namespace)::BufferAgeTest::DrawType,_std::allocator<deqp::egl::(anonymous_namespace)::BufferAgeTest::DrawType>_>
             ._M_impl.super__Vector_impl_data._M_end_of_storage;
  uVar11 = 0;
  do {
    pTVar4 = (TestCaseGroup *)operator_new(0x78);
    pcVar10 = "no_preserve";
    if ((int)uVar11 == 0) {
      pcVar10 = "preserve";
    }
    TestCaseGroup::TestCaseGroup
              (pTVar4,(EglTestContext *)local_e0[1]._vptr_TestNode,pcVar10,
               glcts::fixed_sample_locations_values + 1);
    local_119 = (byte)uVar11 ^ 1;
    lVar9 = 0;
    local_68 = uVar11;
    local_60 = pTVar4;
    do {
      iVar2 = (&DAT_01bdaab8)[lVar9];
      local_58 = lVar9;
      local_d8 = (TestCaseGroup *)operator_new(0x78);
      eglTestCtx = (EglTestContext *)local_e0[1]._vptr_TestNode;
      local_148.
      super__Vector_base<deqp::egl::(anonymous_namespace)::BufferAgeTest::DrawType,_std::allocator<deqp::egl::(anonymous_namespace)::BufferAgeTest::DrawType>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)ppDVar1;
      if (iVar2 == 2) {
        local_d0 = (allocator_type *)0x11;
        local_148.
        super__Vector_base<deqp::egl::(anonymous_namespace)::BufferAgeTest::DrawType,_std::allocator<deqp::egl::(anonymous_namespace)::BufferAgeTest::DrawType>_>
        ._M_impl.super__Vector_impl_data._M_start =
             (pointer)std::__cxx11::string::_M_create((ulong *)&local_148,(ulong)&local_d0);
        *(undefined8 *)
         local_148.
         super__Vector_base<deqp::egl::(anonymous_namespace)::BufferAgeTest::DrawType,_std::allocator<deqp::egl::(anonymous_namespace)::BufferAgeTest::DrawType>_>
         ._M_impl.super__Vector_impl_data._M_start = 0x615f657a69736572;
        pcVar10 = (char *)((long)local_148.
                                 super__Vector_base<deqp::egl::(anonymous_namespace)::BufferAgeTest::DrawType,_std::allocator<deqp::egl::(anonymous_namespace)::BufferAgeTest::DrawType>_>
                                 ._M_impl.super__Vector_impl_data._M_start + 8);
        pcVar10[0] = 'f';
        pcVar10[1] = 't';
        pcVar10[2] = 'e';
        pcVar10[3] = 'r';
        pcVar10[4] = '_';
        pcVar10[5] = 's';
        pcVar10[6] = 'w';
        pcVar10[7] = 'a';
        *(char *)((long)local_148.
                        super__Vector_base<deqp::egl::(anonymous_namespace)::BufferAgeTest::DrawType,_std::allocator<deqp::egl::(anonymous_namespace)::BufferAgeTest::DrawType>_>
                        ._M_impl.super__Vector_impl_data._M_start + 0x10) = 'p';
LAB_00e574ca:
        local_148.
        super__Vector_base<deqp::egl::(anonymous_namespace)::BufferAgeTest::DrawType,_std::allocator<deqp::egl::(anonymous_namespace)::BufferAgeTest::DrawType>_>
        ._M_impl.super__Vector_impl_data._M_finish = (pointer)local_d0;
        *(allocator_type *)
         ((long)local_148.
                super__Vector_base<deqp::egl::(anonymous_namespace)::BufferAgeTest::DrawType,_std::allocator<deqp::egl::(anonymous_namespace)::BufferAgeTest::DrawType>_>
                ._M_impl.super__Vector_impl_data._M_start + (long)local_d0) = (allocator_type)0x0;
        local_148.
        super__Vector_base<deqp::egl::(anonymous_namespace)::BufferAgeTest::DrawType,_std::allocator<deqp::egl::(anonymous_namespace)::BufferAgeTest::DrawType>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)local_d0;
      }
      else {
        if (iVar2 == 1) {
          local_d0 = (allocator_type *)0x12;
          local_148.
          super__Vector_base<deqp::egl::(anonymous_namespace)::BufferAgeTest::DrawType,_std::allocator<deqp::egl::(anonymous_namespace)::BufferAgeTest::DrawType>_>
          ._M_impl.super__Vector_impl_data._M_start =
               (pointer)std::__cxx11::string::_M_create((ulong *)&local_148,(ulong)&local_d0);
          *(undefined8 *)
           local_148.
           super__Vector_base<deqp::egl::(anonymous_namespace)::BufferAgeTest::DrawType,_std::allocator<deqp::egl::(anonymous_namespace)::BufferAgeTest::DrawType>_>
           ._M_impl.super__Vector_impl_data._M_start = 0x625f657a69736572;
          pcVar10 = (char *)((long)local_148.
                                   super__Vector_base<deqp::egl::(anonymous_namespace)::BufferAgeTest::DrawType,_std::allocator<deqp::egl::(anonymous_namespace)::BufferAgeTest::DrawType>_>
                                   ._M_impl.super__Vector_impl_data._M_start + 8);
          pcVar10[0] = 'e';
          pcVar10[1] = 'f';
          pcVar10[2] = 'o';
          pcVar10[3] = 'r';
          pcVar10[4] = 'e';
          pcVar10[5] = '_';
          pcVar10[6] = 's';
          pcVar10[7] = 'w';
          ((char *)((long)local_148.
                          super__Vector_base<deqp::egl::(anonymous_namespace)::BufferAgeTest::DrawType,_std::allocator<deqp::egl::(anonymous_namespace)::BufferAgeTest::DrawType>_>
                          ._M_impl.super__Vector_impl_data._M_start + 0x10))[0] = 'a';
          ((char *)((long)local_148.
                          super__Vector_base<deqp::egl::(anonymous_namespace)::BufferAgeTest::DrawType,_std::allocator<deqp::egl::(anonymous_namespace)::BufferAgeTest::DrawType>_>
                          ._M_impl.super__Vector_impl_data._M_start + 0x10))[1] = 'p';
          goto LAB_00e574ca;
        }
        if (iVar2 == 0) {
          local_148.
          super__Vector_base<deqp::egl::(anonymous_namespace)::BufferAgeTest::DrawType,_std::allocator<deqp::egl::(anonymous_namespace)::BufferAgeTest::DrawType>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x7a697365725f6f6e;
          local_148.
          super__Vector_base<deqp::egl::(anonymous_namespace)::BufferAgeTest::DrawType,_std::allocator<deqp::egl::(anonymous_namespace)::BufferAgeTest::DrawType>_>
          ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x9;
          lStack_130 = CONCAT62(lStack_130._2_6_,0x65);
        }
        else {
          local_148.
          super__Vector_base<deqp::egl::(anonymous_namespace)::BufferAgeTest::DrawType,_std::allocator<deqp::egl::(anonymous_namespace)::BufferAgeTest::DrawType>_>
          ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
          local_148.
          super__Vector_base<deqp::egl::(anonymous_namespace)::BufferAgeTest::DrawType,_std::allocator<deqp::egl::(anonymous_namespace)::BufferAgeTest::DrawType>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage =
               (pointer)((ulong)local_148.
                                super__Vector_base<deqp::egl::(anonymous_namespace)::BufferAgeTest::DrawType,_std::allocator<deqp::egl::(anonymous_namespace)::BufferAgeTest::DrawType>_>
                                ._M_impl.super__Vector_impl_data._M_end_of_storage &
                        0xffffffffffffff00);
        }
      }
      TestCaseGroup::TestCaseGroup
                (local_d8,eglTestCtx,
                 (char *)local_148.
                         super__Vector_base<deqp::egl::(anonymous_namespace)::BufferAgeTest::DrawType,_std::allocator<deqp::egl::(anonymous_namespace)::BufferAgeTest::DrawType>_>
                         ._M_impl.super__Vector_impl_data._M_start,
                 glcts::fixed_sample_locations_values + 1);
      if ((pointer *)
          local_148.
          super__Vector_base<deqp::egl::(anonymous_namespace)::BufferAgeTest::DrawType,_std::allocator<deqp::egl::(anonymous_namespace)::BufferAgeTest::DrawType>_>
          ._M_impl.super__Vector_impl_data._M_start != ppDVar1) {
        operator_delete(local_148.
                        super__Vector_base<deqp::egl::(anonymous_namespace)::BufferAgeTest::DrawType,_std::allocator<deqp::egl::(anonymous_namespace)::BufferAgeTest::DrawType>_>
                        ._M_impl.super__Vector_impl_data._M_start,
                        (ulong)((long)local_148.
                                      super__Vector_base<deqp::egl::(anonymous_namespace)::BufferAgeTest::DrawType,_std::allocator<deqp::egl::(anonymous_namespace)::BufferAgeTest::DrawType>_>
                                      ._M_impl.super__Vector_impl_data._M_end_of_storage + 1));
      }
      if (local_118.
          super__Vector_base<std::vector<deqp::egl::(anonymous_namespace)::BufferAgeTest::DrawType,_std::allocator<deqp::egl::(anonymous_namespace)::BufferAgeTest::DrawType>_>,_std::allocator<std::vector<deqp::egl::(anonymous_namespace)::BufferAgeTest::DrawType,_std::allocator<deqp::egl::(anonymous_namespace)::BufferAgeTest::DrawType>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish !=
          local_118.
          super__Vector_base<std::vector<deqp::egl::(anonymous_namespace)::BufferAgeTest::DrawType,_std::allocator<deqp::egl::(anonymous_namespace)::BufferAgeTest::DrawType>_>,_std::allocator<std::vector<deqp::egl::(anonymous_namespace)::BufferAgeTest::DrawType,_std::allocator<deqp::egl::(anonymous_namespace)::BufferAgeTest::DrawType>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start) {
        local_90 = 0;
        drawTypes = (vector<deqp::egl::(anonymous_namespace)::BufferAgeTest::DrawType,_std::allocator<deqp::egl::(anonymous_namespace)::BufferAgeTest::DrawType>_>
                     *)0x0;
        do {
          local_88 = drawTypes;
          if (drawTypes <
              (vector<deqp::egl::(anonymous_namespace)::BufferAgeTest::DrawType,_std::allocator<deqp::egl::(anonymous_namespace)::BufferAgeTest::DrawType>_>
               *)(((long)local_118.
                         super__Vector_base<std::vector<deqp::egl::(anonymous_namespace)::BufferAgeTest::DrawType,_std::allocator<deqp::egl::(anonymous_namespace)::BufferAgeTest::DrawType>_>,_std::allocator<std::vector<deqp::egl::(anonymous_namespace)::BufferAgeTest::DrawType,_std::allocator<deqp::egl::(anonymous_namespace)::BufferAgeTest::DrawType>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_finish -
                   (long)local_118.
                         super__Vector_base<std::vector<deqp::egl::(anonymous_namespace)::BufferAgeTest::DrawType,_std::allocator<deqp::egl::(anonymous_namespace)::BufferAgeTest::DrawType>_>,_std::allocator<std::vector<deqp::egl::(anonymous_namespace)::BufferAgeTest::DrawType,_std::allocator<deqp::egl::(anonymous_namespace)::BufferAgeTest::DrawType>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start >> 3) * -0x5555555555555555)) {
            local_80 = (_anonymous_namespace_ *)
                       (local_118.
                        super__Vector_base<std::vector<deqp::egl::(anonymous_namespace)::BufferAgeTest::DrawType,_std::allocator<deqp::egl::(anonymous_namespace)::BufferAgeTest::DrawType>_>,_std::allocator<std::vector<deqp::egl::(anonymous_namespace)::BufferAgeTest::DrawType,_std::allocator<deqp::egl::(anonymous_namespace)::BufferAgeTest::DrawType>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_start + (long)drawTypes);
            lVar9 = local_90;
            pvVar13 = drawTypes;
            do {
              this_01 = (_anonymous_namespace_ *)
                        ((long)&((local_118.
                                  super__Vector_base<std::vector<deqp::egl::(anonymous_namespace)::BufferAgeTest::DrawType,_std::allocator<deqp::egl::(anonymous_namespace)::BufferAgeTest::DrawType>_>,_std::allocator<std::vector<deqp::egl::(anonymous_namespace)::BufferAgeTest::DrawType,_std::allocator<deqp::egl::(anonymous_namespace)::BufferAgeTest::DrawType>_>_>_>
                                  ._M_impl.super__Vector_impl_data._M_start)->
                                super__Vector_base<deqp::egl::(anonymous_namespace)::BufferAgeTest::DrawType,_std::allocator<deqp::egl::(anonymous_namespace)::BufferAgeTest::DrawType>_>
                                )._M_impl.super__Vector_impl_data._M_start + lVar9);
              egl::(anonymous_namespace)::generateDrawTypeName_abi_cxx11_
                        (&local_50,this_01,drawTypes);
              plVar5 = (long *)std::__cxx11::string::replace
                                         ((ulong)&local_50,0,(char *)0x0,0x1bda8d7);
              paVar7 = (allocator_type *)(plVar5 + 2);
              if ((allocator_type *)*plVar5 == paVar7) {
                local_c0 = *(long *)paVar7;
                lStack_b8 = plVar5[3];
                local_d0 = (allocator_type *)&local_c0;
              }
              else {
                local_c0 = *(long *)paVar7;
                local_d0 = (allocator_type *)*plVar5;
              }
              local_c8 = plVar5[1];
              *plVar5 = (long)paVar7;
              plVar5[1] = 0;
              *(undefined1 *)(plVar5 + 2) = 0;
              plVar5 = (long *)std::__cxx11::string::append((char *)&local_d0);
              plVar8 = plVar5 + 2;
              if ((pointer *)*plVar5 == (pointer *)plVar8) {
                local_148.
                super__Vector_base<deqp::egl::(anonymous_namespace)::BufferAgeTest::DrawType,_std::allocator<deqp::egl::(anonymous_namespace)::BufferAgeTest::DrawType>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)*plVar8;
                lStack_130 = plVar5[3];
                local_148.
                super__Vector_base<deqp::egl::(anonymous_namespace)::BufferAgeTest::DrawType,_std::allocator<deqp::egl::(anonymous_namespace)::BufferAgeTest::DrawType>_>
                ._M_impl.super__Vector_impl_data._M_start = (pointer)ppDVar1;
              }
              else {
                local_148.
                super__Vector_base<deqp::egl::(anonymous_namespace)::BufferAgeTest::DrawType,_std::allocator<deqp::egl::(anonymous_namespace)::BufferAgeTest::DrawType>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)*plVar8;
                local_148.
                super__Vector_base<deqp::egl::(anonymous_namespace)::BufferAgeTest::DrawType,_std::allocator<deqp::egl::(anonymous_namespace)::BufferAgeTest::DrawType>_>
                ._M_impl.super__Vector_impl_data._M_start = (pointer)*plVar5;
              }
              local_148.
              super__Vector_base<deqp::egl::(anonymous_namespace)::BufferAgeTest::DrawType,_std::allocator<deqp::egl::(anonymous_namespace)::BufferAgeTest::DrawType>_>
              ._M_impl.super__Vector_impl_data._M_finish = (pointer)plVar5[1];
              *plVar5 = (long)plVar8;
              plVar5[1] = 0;
              *(undefined1 *)(plVar5 + 2) = 0;
              egl::(anonymous_namespace)::generateDrawTypeName_abi_cxx11_
                        (&local_b0,local_80,
                         (vector<deqp::egl::(anonymous_namespace)::BufferAgeTest::DrawType,_std::allocator<deqp::egl::(anonymous_namespace)::BufferAgeTest::DrawType>_>
                          *)local_148.
                            super__Vector_base<deqp::egl::(anonymous_namespace)::BufferAgeTest::DrawType,_std::allocator<deqp::egl::(anonymous_namespace)::BufferAgeTest::DrawType>_>
                            ._M_impl.super__Vector_impl_data._M_finish);
              paVar7 = (allocator_type *)0xf;
              if ((pointer *)
                  local_148.
                  super__Vector_base<deqp::egl::(anonymous_namespace)::BufferAgeTest::DrawType,_std::allocator<deqp::egl::(anonymous_namespace)::BufferAgeTest::DrawType>_>
                  ._M_impl.super__Vector_impl_data._M_start != ppDVar1) {
                paVar7 = (allocator_type *)
                         local_148.
                         super__Vector_base<deqp::egl::(anonymous_namespace)::BufferAgeTest::DrawType,_std::allocator<deqp::egl::(anonymous_namespace)::BufferAgeTest::DrawType>_>
                         ._M_impl.super__Vector_impl_data._M_end_of_storage;
              }
              if (paVar7 < (allocator_type *)
                           ((long)local_148.
                                  super__Vector_base<deqp::egl::(anonymous_namespace)::BufferAgeTest::DrawType,_std::allocator<deqp::egl::(anonymous_namespace)::BufferAgeTest::DrawType>_>
                                  ._M_impl.super__Vector_impl_data._M_finish +
                           local_b0._M_string_length)) {
                uVar12 = (allocator_type *)0xf;
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
                  uVar12 = local_b0.field_2._M_allocated_capacity;
                }
                if ((ulong)uVar12 <
                    (allocator_type *)
                    ((long)local_148.
                           super__Vector_base<deqp::egl::(anonymous_namespace)::BufferAgeTest::DrawType,_std::allocator<deqp::egl::(anonymous_namespace)::BufferAgeTest::DrawType>_>
                           ._M_impl.super__Vector_impl_data._M_finish + local_b0._M_string_length))
                goto LAB_00e576b8;
                puVar6 = (undefined8 *)
                         std::__cxx11::string::replace
                                   ((ulong)&local_b0,0,(char *)0x0,
                                    (ulong)local_148.
                                           super__Vector_base<deqp::egl::(anonymous_namespace)::BufferAgeTest::DrawType,_std::allocator<deqp::egl::(anonymous_namespace)::BufferAgeTest::DrawType>_>
                                           ._M_impl.super__Vector_impl_data._M_start);
              }
              else {
LAB_00e576b8:
                puVar6 = (undefined8 *)
                         std::__cxx11::string::_M_append
                                   ((char *)&local_148,(ulong)local_b0._M_dataplus._M_p);
              }
              local_100 = &local_f0;
              plVar5 = puVar6 + 2;
              if ((long *)*puVar6 == plVar5) {
                local_f0 = *plVar5;
                uStack_e8 = puVar6[3];
              }
              else {
                local_f0 = *plVar5;
                local_100 = (long *)*puVar6;
              }
              local_f8 = puVar6[1];
              *puVar6 = plVar5;
              puVar6[1] = 0;
              *(undefined1 *)plVar5 = 0;
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
                operator_delete(local_b0._M_dataplus._M_p,
                                (ulong)(local_b0.field_2._M_allocated_capacity + 1));
              }
              if ((pointer *)
                  local_148.
                  super__Vector_base<deqp::egl::(anonymous_namespace)::BufferAgeTest::DrawType,_std::allocator<deqp::egl::(anonymous_namespace)::BufferAgeTest::DrawType>_>
                  ._M_impl.super__Vector_impl_data._M_start != ppDVar1) {
                operator_delete(local_148.
                                super__Vector_base<deqp::egl::(anonymous_namespace)::BufferAgeTest::DrawType,_std::allocator<deqp::egl::(anonymous_namespace)::BufferAgeTest::DrawType>_>
                                ._M_impl.super__Vector_impl_data._M_start,
                                (ulong)((long)local_148.
                                              super__Vector_base<deqp::egl::(anonymous_namespace)::BufferAgeTest::DrawType,_std::allocator<deqp::egl::(anonymous_namespace)::BufferAgeTest::DrawType>_>
                                              ._M_impl.super__Vector_impl_data._M_end_of_storage + 1
                                       ));
              }
              if (local_d0 != (allocator_type *)&local_c0) {
                operator_delete(local_d0,local_c0 + 1);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_50._M_dataplus._M_p != &local_50.field_2) {
                operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1
                               );
              }
              this_00 = (TestCase *)operator_new(0x1b18);
              plVar5 = local_100;
              TestCase::TestCase(this_00,(EglTestContext *)local_e0[1]._vptr_TestNode,
                                 (char *)local_100,glcts::fixed_sample_locations_values + 1);
              (this_00->super_TestCase).super_TestNode._vptr_TestNode =
                   (_func_int **)&PTR__BufferAgeTest_02157208;
              dVar3 = deStringHash((char *)plVar5);
              *(deUint32 *)&this_00[1].super_TestCase.super_TestNode._vptr_TestNode = dVar3;
              *(byte *)((long)&this_00[1].super_TestCase.super_TestNode._vptr_TestNode + 4) =
                   local_119;
              std::
              vector<deqp::egl::(anonymous_namespace)::BufferAgeTest::DrawType,_std::allocator<deqp::egl::(anonymous_namespace)::BufferAgeTest::DrawType>_>
              ::vector((vector<deqp::egl::(anonymous_namespace)::BufferAgeTest::DrawType,_std::allocator<deqp::egl::(anonymous_namespace)::BufferAgeTest::DrawType>_>
                        *)&this_00[1].super_TestCase.super_TestNode.m_testCtx,
                       (vector<deqp::egl::(anonymous_namespace)::BufferAgeTest::DrawType,_std::allocator<deqp::egl::(anonymous_namespace)::BufferAgeTest::DrawType>_>
                        *)this_01);
              std::
              vector<deqp::egl::(anonymous_namespace)::BufferAgeTest::DrawType,_std::allocator<deqp::egl::(anonymous_namespace)::BufferAgeTest::DrawType>_>
              ::vector((vector<deqp::egl::(anonymous_namespace)::BufferAgeTest::DrawType,_std::allocator<deqp::egl::(anonymous_namespace)::BufferAgeTest::DrawType>_>
                        *)&this_00[1].super_TestCase.super_TestNode.m_name.field_2,
                       (vector<deqp::egl::(anonymous_namespace)::BufferAgeTest::DrawType,_std::allocator<deqp::egl::(anonymous_namespace)::BufferAgeTest::DrawType>_>
                        *)local_80);
              *(undefined4 *)
               &this_00[1].super_TestCase.super_TestNode.m_description._M_string_length = 0;
              this_00[1].super_TestCase.super_TestNode.m_children.
              super__Vector_base<tcu::TestNode_*,_std::allocator<tcu::TestNode_*>_>._M_impl.
              super__Vector_impl_data._M_finish = (pointer)0x0;
              this_00[1].super_TestCase.super_TestNode.m_description.field_2._M_allocated_capacity =
                   0;
              *(undefined8 *)
               ((long)&this_00[1].super_TestCase.super_TestNode.m_description.field_2 + 8) = 0;
              *(undefined8 *)&this_00[1].super_TestCase.super_TestNode.m_nodeType = 0;
              glw::Functions::Functions
                        ((Functions *)
                         &this_00[1].super_TestCase.super_TestNode.m_children.
                          super__Vector_base<tcu::TestNode_*,_std::allocator<tcu::TestNode_*>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage);
              *(undefined8 *)&this_00[0x39].super_TestCase.super_TestNode.m_nodeType = 0;
              this_00[0x39].super_TestCase.super_TestNode.m_children.
              super__Vector_base<tcu::TestNode_*,_std::allocator<tcu::TestNode_*>_>._M_impl.
              super__Vector_impl_data._M_start = (pointer)0x0;
              tcu::TestNode::addChild((TestNode *)local_d8,(TestNode *)this_00);
              drawTypes = extraout_RDX;
              if (local_100 != &local_f0) {
                operator_delete(local_100,local_f0 + 1);
                drawTypes = extraout_RDX_00;
              }
              pvVar13 = (vector<deqp::egl::(anonymous_namespace)::BufferAgeTest::DrawType,_std::allocator<deqp::egl::(anonymous_namespace)::BufferAgeTest::DrawType>_>
                         *)((long)&(pvVar13->
                                   super__Vector_base<deqp::egl::(anonymous_namespace)::BufferAgeTest::DrawType,_std::allocator<deqp::egl::(anonymous_namespace)::BufferAgeTest::DrawType>_>
                                   )._M_impl.super__Vector_impl_data._M_start + 1);
              lVar9 = lVar9 + 0x18;
            } while (pvVar13 < (vector<deqp::egl::(anonymous_namespace)::BufferAgeTest::DrawType,_std::allocator<deqp::egl::(anonymous_namespace)::BufferAgeTest::DrawType>_>
                                *)(((long)local_118.
                                          super__Vector_base<std::vector<deqp::egl::(anonymous_namespace)::BufferAgeTest::DrawType,_std::allocator<deqp::egl::(anonymous_namespace)::BufferAgeTest::DrawType>_>,_std::allocator<std::vector<deqp::egl::(anonymous_namespace)::BufferAgeTest::DrawType,_std::allocator<deqp::egl::(anonymous_namespace)::BufferAgeTest::DrawType>_>_>_>
                                          ._M_impl.super__Vector_impl_data._M_finish -
                                    (long)local_118.
                                          super__Vector_base<std::vector<deqp::egl::(anonymous_namespace)::BufferAgeTest::DrawType,_std::allocator<deqp::egl::(anonymous_namespace)::BufferAgeTest::DrawType>_>,_std::allocator<std::vector<deqp::egl::(anonymous_namespace)::BufferAgeTest::DrawType,_std::allocator<deqp::egl::(anonymous_namespace)::BufferAgeTest::DrawType>_>_>_>
                                          ._M_impl.super__Vector_impl_data._M_start >> 3) *
                                  -0x5555555555555555));
          }
          drawTypes = (vector<deqp::egl::(anonymous_namespace)::BufferAgeTest::DrawType,_std::allocator<deqp::egl::(anonymous_namespace)::BufferAgeTest::DrawType>_>
                       *)((long)&(local_88->
                                 super__Vector_base<deqp::egl::(anonymous_namespace)::BufferAgeTest::DrawType,_std::allocator<deqp::egl::(anonymous_namespace)::BufferAgeTest::DrawType>_>
                                 )._M_impl.super__Vector_impl_data._M_start + 1);
          local_90 = local_90 + 0x18;
        } while (drawTypes <
                 (vector<deqp::egl::(anonymous_namespace)::BufferAgeTest::DrawType,_std::allocator<deqp::egl::(anonymous_namespace)::BufferAgeTest::DrawType>_>
                  *)(((long)local_118.
                            super__Vector_base<std::vector<deqp::egl::(anonymous_namespace)::BufferAgeTest::DrawType,_std::allocator<deqp::egl::(anonymous_namespace)::BufferAgeTest::DrawType>_>,_std::allocator<std::vector<deqp::egl::(anonymous_namespace)::BufferAgeTest::DrawType,_std::allocator<deqp::egl::(anonymous_namespace)::BufferAgeTest::DrawType>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_finish -
                      (long)local_118.
                            super__Vector_base<std::vector<deqp::egl::(anonymous_namespace)::BufferAgeTest::DrawType,_std::allocator<deqp::egl::(anonymous_namespace)::BufferAgeTest::DrawType>_>,_std::allocator<std::vector<deqp::egl::(anonymous_namespace)::BufferAgeTest::DrawType,_std::allocator<deqp::egl::(anonymous_namespace)::BufferAgeTest::DrawType>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_start >> 3) * -0x5555555555555555));
      }
      pTVar4 = local_60;
      tcu::TestNode::addChild((TestNode *)local_60,(TestNode *)local_d8);
      lVar9 = local_58 + 1;
    } while (lVar9 != 3);
    tcu::TestNode::addChild(local_e0,(TestNode *)pTVar4);
    uVar11 = (ulong)((int)local_68 + 1);
    if ((int)local_68 != 0) {
      std::
      vector<std::vector<deqp::egl::(anonymous_namespace)::BufferAgeTest::DrawType,_std::allocator<deqp::egl::(anonymous_namespace)::BufferAgeTest::DrawType>_>,_std::allocator<std::vector<deqp::egl::(anonymous_namespace)::BufferAgeTest::DrawType,_std::allocator<deqp::egl::(anonymous_namespace)::BufferAgeTest::DrawType>_>_>_>
      ::~vector(&local_118);
      return extraout_EAX;
    }
  } while( true );
}

Assistant:

void BufferAgeTests::init (void)
{
	const BufferAgeTest::DrawType clearRender[] =
	{
		BufferAgeTest::DRAWTYPE_GLES2_CLEAR,
		BufferAgeTest::DRAWTYPE_GLES2_RENDER
	};

	const BufferAgeTest::DrawType renderClear[] =
	{
		BufferAgeTest::DRAWTYPE_GLES2_RENDER,
		BufferAgeTest::DRAWTYPE_GLES2_CLEAR
	};

	const BufferAgeTest::ResizeType resizeTypes[] =
	{
		BufferAgeTest::RESIZETYPE_NONE,
		BufferAgeTest::RESIZETYPE_BEFORE_SWAP,
		BufferAgeTest::RESIZETYPE_AFTER_SWAP
	};

	vector< vector<BufferAgeTest::DrawType> > frameDrawTypes;
	frameDrawTypes.push_back(vector<BufferAgeTest::DrawType> ());
	frameDrawTypes.push_back(vector<BufferAgeTest::DrawType> (1, BufferAgeTest::DRAWTYPE_GLES2_CLEAR));
	frameDrawTypes.push_back(vector<BufferAgeTest::DrawType> (1, BufferAgeTest::DRAWTYPE_GLES2_RENDER));
	frameDrawTypes.push_back(vector<BufferAgeTest::DrawType> (2, BufferAgeTest::DRAWTYPE_GLES2_CLEAR));
	frameDrawTypes.push_back(vector<BufferAgeTest::DrawType> (2, BufferAgeTest::DRAWTYPE_GLES2_RENDER));
	frameDrawTypes.push_back(vector<BufferAgeTest::DrawType> (DE_ARRAY_BEGIN(clearRender), DE_ARRAY_END(clearRender)));
	frameDrawTypes.push_back(vector<BufferAgeTest::DrawType> (DE_ARRAY_BEGIN(renderClear), DE_ARRAY_END(renderClear)));

	for (int preserveNdx = 0; preserveNdx < 2; preserveNdx++)
	{
		const bool				preserve		= (preserveNdx == 0);
		TestCaseGroup* const	preserveGroup	= new TestCaseGroup(m_eglTestCtx, (preserve ? "preserve" : "no_preserve"), "");

		for (size_t resizeTypeNdx = 0; resizeTypeNdx < DE_LENGTH_OF_ARRAY(resizeTypes); resizeTypeNdx++)
		{
			const BufferAgeTest::ResizeType	resizeType	= resizeTypes[resizeTypeNdx];
			TestCaseGroup* const			resizeGroup	= new TestCaseGroup(m_eglTestCtx, generateResizeGroupName(resizeType).c_str(), "");

			for (size_t evenNdx = 0; evenNdx < frameDrawTypes.size(); evenNdx++)
			{
				const vector<BufferAgeTest::DrawType>& evenFrameDrawType = frameDrawTypes[evenNdx];

				for (size_t oddNdx = evenNdx; oddNdx < frameDrawTypes.size(); oddNdx++)
				{
					const vector<BufferAgeTest::DrawType>&	oddFrameDrawType	= frameDrawTypes[oddNdx];
					const std::string						name				= generateTestName(oddFrameDrawType, evenFrameDrawType);
					resizeGroup->addChild(new BufferAgeTest(m_eglTestCtx, preserve, oddFrameDrawType, evenFrameDrawType, BufferAgeTest::RESIZETYPE_NONE, name.c_str(), ""));
				}
			}

			preserveGroup->addChild(resizeGroup);
		}
		addChild(preserveGroup);
	}
}